

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# comm.c
# Opt level: O1

bool check_reconnect(DESCRIPTOR_DATA *d,char *name,bool fConn)

{
  short *psVar1;
  CHAR_DATA *pCVar2;
  CHAR_DATA *ch;
  bool bVar3;
  int min_level;
  char *pcVar4;
  OBJ_DATA *pOVar5;
  char *bstr;
  CHAR_DATA *ch_00;
  bool bVar6;
  string_view fmt;
  
  bVar6 = char_list != (CHAR_DATA *)0x0;
  ch_00 = char_list;
  if (bVar6) {
    do {
      bVar3 = is_npc(ch_00);
      if ((!bVar3) && ((!fConn || (ch_00->desc == (DESCRIPTOR_DATA *)0x0)))) {
        pcVar4 = d->character->true_name;
        if (pcVar4 == (char *)0x0) {
          pcVar4 = d->character->name;
        }
        bstr = ch_00->true_name;
        if (bstr == (char *)0x0) {
          bstr = ch_00->name;
        }
        bVar3 = str_cmp(pcVar4,bstr);
        if (!bVar3) {
          pCVar2 = char_list;
          if (!fConn) {
            free_pstring(d->character->pcdata->pwd);
            pcVar4 = palloc_string(ch_00->pcdata->pwd);
            d->character->pcdata->pwd = pcVar4;
            return bVar6;
          }
          while (ch = pCVar2, ch != (CHAR_DATA *)0x0) {
            pCVar2 = ch->next;
            bVar3 = is_npc(ch);
            if ((bVar3) &&
               (((bVar3 = is_affected(ch,(int)gsn_animate_dead), bVar3 ||
                 (bVar3 = is_affected_by(ch,0x12), bVar3)) && (ch->master == d->character)))) {
              extract_char(ch,true);
            }
          }
          free_char(d->character);
          d->character = ch_00;
          ch_00->desc = d;
          ch_00->timer = 0;
          send_to_char("Reconnecting. Type replay to see missed tells.\n\r",ch_00);
          if (ch_00->invis_level < 0x33) {
            act_new("$n has reconnected.",ch_00,(void *)0x0,(void *)0x0,0,5);
          }
          pcVar4 = palloc_string(ch_00->desc->host);
          ch_00->pcdata->host = pcVar4;
          for (pOVar5 = ch_00->carrying; pOVar5 != (OBJ_DATA *)0x0; pOVar5 = pOVar5->next_content) {
            psVar1 = &pOVar5->pIndexData->limcount;
            *psVar1 = *psVar1 + 1;
          }
          fmt._M_str = "{}@{} reconnected.";
          fmt._M_len = 0x12;
          CLogger::Info<char*&,char*&>((CLogger *)&RS.field_0x140,fmt,&ch_00->name,&d->host);
          min_level = get_trust(ch_00);
          wiznet("$N recovers from link death.",ch_00,(OBJ_DATA *)0x0,4,0,min_level);
          d->connected = 0;
          return bVar6;
        }
      }
      bVar6 = ch_00->next != (CHAR_DATA *)0x0;
      ch_00 = ch_00->next;
    } while (bVar6);
  }
  return bVar6;
}

Assistant:

bool check_reconnect(DESCRIPTOR_DATA *d, char *name, bool fConn)
{
	CHAR_DATA *ch, *fch, *fch_next;
	OBJ_DATA *obj;

	for (ch = char_list; ch != nullptr; ch = ch->next)
	{
		if (!is_npc(ch)
			&& (!fConn || ch->desc == nullptr)
			&& !str_cmp((d->character->true_name ? d->character->true_name : d->character->name), (ch->true_name ? ch->true_name : ch->name)))
		{
			if (fConn == false)
			{
				free_pstring(d->character->pcdata->pwd);
				d->character->pcdata->pwd = palloc_string(ch->pcdata->pwd);
			}
			else
			{
				for (fch = char_list; fch; fch = fch_next)
				{
					fch_next = fch->next;
					if (is_npc(fch)
						&& (is_affected(fch, gsn_animate_dead) || is_affected_by(fch, AFF_CHARM))
						&& fch->master == d->character)
					{
						extract_char(fch, true);
					}
				}

				free_char(d->character);
				d->character = ch;

				ch->desc = d;
				ch->timer = 0;

				send_to_char("Reconnecting. Type replay to see missed tells.\n\r", ch);

				if (ch->invis_level < 51)
					act("$n has reconnected.", ch, nullptr, nullptr, TO_ROOM);

				ch->pcdata->host = palloc_string(ch->desc->host);
				/* Limit crap to balance reconnect objects from extracted link object */
				for (obj = ch->carrying; obj != nullptr; obj = obj->next_content)
				{
					obj->pIndexData->limcount++;
				}

				RS.Logger.Info("{}@{} reconnected.", ch->name, d->host);

				wiznet("$N recovers from link death.", ch, nullptr, WIZ_LINKS, 0, get_trust(ch));
				d->connected = CON_PLAYING;
			}

			return true;
		}
	}

	return false;
}